

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.hpp
# Opt level: O0

void __thiscall cplus::utils::List<int_*>::forEach(List<int_*> *this,function<void_(int_*&)> *func)

{
  int **__args;
  ListPoint *pLVar1;
  ListPoint *next;
  ListPoint *preview;
  ListPoint *state;
  function<void_(int_*&)> *func_local;
  List<int_*> *this_local;
  
  preview = this->listBegin;
  next = this->listEnd;
  if (preview != (ListPoint *)0x0) {
    do {
      __args = ListPoint::get(preview);
      std::function<void_(int_*&)>::operator()(func,__args);
      pLVar1 = ListPoint::next(preview,next);
      next = preview;
      preview = pLVar1;
    } while (pLVar1 != this->listBegin);
  }
  return;
}

Assistant:

void forEach(const std::function<void(T &)> &func) const {
				auto state = listBegin;
				auto preview = listEnd;
				if (state != nullptr) {
					do {
						func(state->get());
						auto next = state->next(preview);
						preview = state;
						state = next;
					} while (state != listBegin);
				}
			}